

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O1

Instruction * __thiscall spvtools::opt::InstructionBuilder::AddUnreachable(InstructionBuilder *this)

{
  IRContext *c;
  Instruction *pIVar1;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> select;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  pIVar1 = (Instruction *)operator_new(0x70);
  c = this->context_;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_38,0,0)
  ;
  Instruction::Instruction(pIVar1,c,OpUnreachable,0,0,(OperandList *)&local_38);
  local_40._M_head_impl = pIVar1;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_38);
  pIVar1 = AddInstruction(this,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                *)&local_40);
  if (local_40._M_head_impl != (Instruction *)0x0) {
    (*((local_40._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  return pIVar1;
}

Assistant:

Instruction* AddUnreachable() {
    std::unique_ptr<Instruction> select(
        new Instruction(GetContext(), spv::Op::OpUnreachable, 0, 0,
                        std::initializer_list<Operand>{}));
    return AddInstruction(std::move(select));
  }